

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall
QPDF::optimize(QPDF *this,ObjTable *obj,function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  function<int_(QPDFObjectHandle_&)> local_40;
  function<int_(QPDFObjectHandle_&)> *local_20;
  function<int_(QPDFObjectHandle_&)> *skip_stream_parameters_local;
  ObjTable *obj_local;
  QPDF *this_local;
  
  local_20 = skip_stream_parameters;
  skip_stream_parameters_local = (function<int_(QPDFObjectHandle_&)> *)obj;
  obj_local = (ObjTable *)this;
  std::function<int_(QPDFObjectHandle_&)>::function(&local_40,skip_stream_parameters);
  optimize_internal<QPDFWriter::ObjTable>(this,obj,true,&local_40);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_40);
  return;
}

Assistant:

void
QPDF::optimize(
    QPDFWriter::ObjTable const& obj, std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    optimize_internal(obj, true, skip_stream_parameters);
}